

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
          (basic_writer<fmt::v5::output_range<char*,char>> *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
          *f)

{
  byte bVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t __len_1;
  ulong __n;
  ulong uVar5;
  size_t __len;
  size_t __n_00;
  char __tmp;
  
  uVar5 = (ulong)spec->width_;
  uVar2 = f->size_;
  __n_00 = uVar5 - uVar2;
  if (uVar5 < uVar2 || __n_00 == 0) {
LAB_00197e7f:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(char **)this);
    return;
  }
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    __n = __n_00 >> 1;
    pvVar4 = *(void **)this;
    pvVar3 = pvVar4;
    if (1 < __n_00) {
      pvVar3 = (void *)((long)pvVar4 + __n);
      memset(pvVar4,(uint)bVar1,__n);
    }
    *(void **)this = pvVar3;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(char **)this);
    pvVar3 = *(void **)this;
    if (uVar5 == uVar2) goto LAB_00197f11;
    __n_00 = __n_00 - __n;
    pvVar4 = pvVar3;
    pvVar3 = (void *)((long)pvVar3 + __n_00);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pvVar4 = *(void **)this;
      pvVar3 = pvVar4;
      if (uVar5 != uVar2) {
        pvVar3 = (void *)((long)pvVar4 + __n_00);
        memset(pvVar4,(uint)bVar1,__n_00);
      }
      *(void **)this = pvVar3;
      goto LAB_00197e7f;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)f,(char **)this);
    pvVar3 = *(void **)this;
    if (uVar5 == uVar2) goto LAB_00197f11;
    pvVar4 = pvVar3;
    pvVar3 = (void *)((long)pvVar3 + __n_00);
  }
  memset(pvVar4,(uint)bVar1,__n_00);
LAB_00197f11:
  *(void **)this = pvVar3;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }